

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.c
# Opt level: O3

token * bitwise_and_expression(dmr_C *C,token *token,expression **tree)

{
  token *ptVar1;
  expression *peVar2;
  char *pcVar3;
  position pVar4;
  expression *peVar5;
  expression *local_50;
  allocator *local_48;
  expression **local_40;
  expression *local_38;
  expression *right;
  
  local_50 = (expression *)0x0;
  local_40 = tree;
  ptVar1 = equality_expression(C,token,&local_50);
  if (local_50 == (expression *)0x0) {
    peVar2 = (expression *)0x0;
  }
  else {
    pVar4 = ptVar1->pos;
    peVar2 = local_50;
    if ((pVar4._0_4_ & 0x3f) == 0x11) {
      local_48 = &C->expression_allocator;
      peVar5 = local_50;
      do {
        local_38 = (expression *)0x0;
        peVar2 = peVar5;
        if ((ptVar1->field_2).special != 0x26) break;
        peVar2 = (expression *)dmrC_allocator_allocate(local_48,0);
        *(undefined1 *)peVar2 = 5;
        peVar2->pos = pVar4;
        ptVar1 = equality_expression(C,ptVar1->next,&local_38);
        if (local_38 == (expression *)0x0) {
          pcVar3 = dmrC_show_special(C,0x26);
          dmrC_sparse_error(C,ptVar1->pos,"No right hand side of \'%s\'-expression",pcVar3);
          peVar2 = peVar5;
          break;
        }
        peVar2->field_0x1 =
             (byte)((ushort)*(undefined2 *)peVar5 >> 8) &
             (byte)((ushort)*(undefined2 *)local_38 >> 8) & 1;
        peVar2->op = 0x26;
        (peVar2->field_5).field_3.unop = peVar5;
        (peVar2->field_5).field_2.string = (string *)local_38;
        pVar4 = ptVar1->pos;
        peVar5 = peVar2;
      } while ((pVar4._0_4_ & 0x3f) == 0x11);
    }
  }
  *local_40 = peVar2;
  return ptVar1;
}

Assistant:

static struct token *bitwise_and_expression(struct dmr_C *C, struct token *token, struct expression **tree)
{
	LR_BINOP_EXPRESSION(C,
		token, tree, EXPR_BINOP, equality_expression,
		(op == '&')
	);
}